

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolIPv4.cpp
# Opt level: O0

void __thiscall
ProtocolIPv4::Transmit
          (ProtocolIPv4 *this,DataBuffer *buffer,uint8_t protocol,uint8_t *targetIP,
          uint8_t *sourceIP)

{
  uint16_t value;
  size_t sVar1;
  uint8_t *puVar2;
  uint8_t *packet;
  uint8_t *targetMAC;
  uint16_t checksum;
  uint8_t *sourceIP_local;
  uint8_t *targetIP_local;
  uint8_t protocol_local;
  DataBuffer *buffer_local;
  ProtocolIPv4 *this_local;
  
  sVar1 = header_size();
  buffer->Packet = buffer->Packet + -sVar1;
  sVar1 = header_size();
  buffer->Length = buffer->Length + (short)sVar1;
  puVar2 = buffer->Packet;
  *puVar2 = 'E';
  puVar2[1] = '\0';
  Pack16(puVar2,2,buffer->Length);
  this->PacketID = this->PacketID + 1;
  Pack16(puVar2,4,this->PacketID);
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  puVar2[8] = ' ';
  puVar2[9] = protocol;
  Pack16(puVar2,10,0);
  PackBytes(puVar2,0xc,sourceIP,4);
  PackBytes(puVar2,0x10,targetIP,4);
  value = FCS::Checksum(puVar2,0x14);
  Pack16(puVar2,10,value);
  puVar2 = ProtocolARP::Protocol2Hardware(this->ARP,targetIP);
  if (puVar2 == (uint8_t *)0x0) {
    osQueue::Put(&this->UnresolvedQueue,buffer);
  }
  else {
    (*this->MAC->_vptr_InterfaceMAC[10])(this->MAC,buffer,puVar2,0x800);
  }
  return;
}

Assistant:

void ProtocolIPv4::Transmit(DataBuffer* buffer,
                            uint8_t protocol,
                            const uint8_t* targetIP,
                            const uint8_t* sourceIP)
{
    uint16_t checksum;
    const uint8_t* targetMAC;
    uint8_t* packet;

    buffer->Packet -= header_size();
    buffer->Length += header_size();
    packet = buffer->Packet;

    packet[0] = 0x45; // Version and HeaderSize
    packet[1] = 0;    // ToS
    Pack16(packet, 2, buffer->Length);

    PacketID++;
    Pack16(packet, 4, PacketID);
    packet[6] = 0; // Flags & FragmentOffset
    packet[7] = 0; // rest of FragmentOffset

    packet[8] = 32; // TTL
    packet[9] = protocol;
    Pack16(packet, 10, 0); // checksum placeholder
    PackBytes(packet, 12, sourceIP, 4);
    PackBytes(packet, 16, targetIP, 4);

    checksum = FCS::Checksum(packet, 20);
    Pack16(packet, 10, checksum);

    targetMAC = ARP.Protocol2Hardware(targetIP);
    if (targetMAC != nullptr)
    {
        MAC.Transmit(buffer, targetMAC, 0x0800);
    }
    else
    {
        // Could not find MAC address, ARP for it
        UnresolvedQueue.Put(buffer);
    }
}